

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zes_nullddi.cpp
# Opt level: O0

ze_result_t
driver::zesFabricPortGetLinkType(zes_fabric_port_handle_t hPort,zes_fabric_link_type_t *pLinkType)

{
  zes_pfnFabricPortGetLinkType_t pfnGetLinkType;
  ze_result_t result;
  zes_fabric_link_type_t *pLinkType_local;
  zes_fabric_port_handle_t hPort_local;
  
  pfnGetLinkType._4_4_ = ZE_RESULT_SUCCESS;
  if (DAT_0011cd18 != (code *)0x0) {
    pfnGetLinkType._4_4_ = (*DAT_0011cd18)(hPort,pLinkType);
  }
  return pfnGetLinkType._4_4_;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zesFabricPortGetLinkType(
        zes_fabric_port_handle_t hPort,                 ///< [in] Handle for the component.
        zes_fabric_link_type_t* pLinkType               ///< [in,out] Will contain details about the link attached to the Fabric
                                                        ///< port.
        )
    {
        ze_result_t result = ZE_RESULT_SUCCESS;

        // if the driver has created a custom function, then call it instead of using the generic path
        auto pfnGetLinkType = context.zesDdiTable.FabricPort.pfnGetLinkType;
        if( nullptr != pfnGetLinkType )
        {
            result = pfnGetLinkType( hPort, pLinkType );
        }
        else
        {
            // generic implementation
        }

        return result;
    }